

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,FileOptions *from)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  InternalMetadataWithArena *this_00;
  LogFinisher local_d5;
  uint32 cached_has_bits;
  byte local_c1;
  LogMessage local_c0;
  FileOptions *local_88;
  FileOptions *from_local;
  FileOptions *this_local;
  InternalMetadataWithArena *local_70;
  InternalMetadataWithArena *local_68;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_c1 = 0;
  local_88 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x23ad);
    local_c1 = 1;
    other = internal::LogMessage::operator<<(&local_c0,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_d5,other);
  }
  if ((local_c1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_c0);
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&local_88->_extensions_);
  this_00 = &this->_internal_metadata_;
  this_local = (FileOptions *)&local_88->_internal_metadata_;
  local_70 = this_00;
  local_68 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom(this_00,&local_28->unknown_fields);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&this->uninterpreted_option_,&local_88->uninterpreted_option_);
  local_38 = &local_88->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_java_package(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->java_package_,psVar2,(local_88->java_package_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      set_has_java_outer_classname(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->java_outer_classname_,psVar2,(local_88->java_outer_classname_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      set_has_go_package(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->go_package_,psVar2,(local_88->go_package_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      set_has_objc_class_prefix(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->objc_class_prefix_,psVar2,(local_88->objc_class_prefix_).ptr_);
    }
    if ((uVar1 & 0x10) != 0) {
      set_has_csharp_namespace(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->csharp_namespace_,psVar2,(local_88->csharp_namespace_).ptr_);
    }
    if ((uVar1 & 0x20) != 0) {
      set_has_swift_prefix(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->swift_prefix_,psVar2,(local_88->swift_prefix_).ptr_);
    }
    if ((uVar1 & 0x40) != 0) {
      set_has_php_class_prefix(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->php_class_prefix_,psVar2,(local_88->php_class_prefix_).ptr_);
    }
    if ((uVar1 & 0x80) != 0) {
      this->java_multiple_files_ = (bool)(local_88->java_multiple_files_ & 1);
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this->java_generate_equals_and_hash_ = (bool)(local_88->java_generate_equals_and_hash_ & 1);
    }
    if ((uVar1 & 0x200) != 0) {
      this->java_string_check_utf8_ = (bool)(local_88->java_string_check_utf8_ & 1);
    }
    if ((uVar1 & 0x400) != 0) {
      this->cc_generic_services_ = (bool)(local_88->cc_generic_services_ & 1);
    }
    if ((uVar1 & 0x800) != 0) {
      this->java_generic_services_ = (bool)(local_88->java_generic_services_ & 1);
    }
    if ((uVar1 & 0x1000) != 0) {
      this->py_generic_services_ = (bool)(local_88->py_generic_services_ & 1);
    }
    if ((uVar1 & 0x2000) != 0) {
      this->deprecated_ = (bool)(local_88->deprecated_ & 1);
    }
    if ((uVar1 & 0x4000) != 0) {
      this->cc_enable_arenas_ = (bool)(local_88->cc_enable_arenas_ & 1);
    }
    if ((uVar1 & 0x8000) != 0) {
      this->optimize_for_ = local_88->optimize_for_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void FileOptions::MergeFrom(const FileOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_java_package();
      java_package_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.java_package_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_java_outer_classname();
      java_outer_classname_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.java_outer_classname_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_go_package();
      go_package_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.go_package_);
    }
    if (cached_has_bits & 0x00000008u) {
      set_has_objc_class_prefix();
      objc_class_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.objc_class_prefix_);
    }
    if (cached_has_bits & 0x00000010u) {
      set_has_csharp_namespace();
      csharp_namespace_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.csharp_namespace_);
    }
    if (cached_has_bits & 0x00000020u) {
      set_has_swift_prefix();
      swift_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.swift_prefix_);
    }
    if (cached_has_bits & 0x00000040u) {
      set_has_php_class_prefix();
      php_class_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.php_class_prefix_);
    }
    if (cached_has_bits & 0x00000080u) {
      java_multiple_files_ = from.java_multiple_files_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      java_generate_equals_and_hash_ = from.java_generate_equals_and_hash_;
    }
    if (cached_has_bits & 0x00000200u) {
      java_string_check_utf8_ = from.java_string_check_utf8_;
    }
    if (cached_has_bits & 0x00000400u) {
      cc_generic_services_ = from.cc_generic_services_;
    }
    if (cached_has_bits & 0x00000800u) {
      java_generic_services_ = from.java_generic_services_;
    }
    if (cached_has_bits & 0x00001000u) {
      py_generic_services_ = from.py_generic_services_;
    }
    if (cached_has_bits & 0x00002000u) {
      deprecated_ = from.deprecated_;
    }
    if (cached_has_bits & 0x00004000u) {
      cc_enable_arenas_ = from.cc_enable_arenas_;
    }
    if (cached_has_bits & 0x00008000u) {
      optimize_for_ = from.optimize_for_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}